

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashlin.h
# Opt level: O0

tommy_hashlin_node ** tommy_hashlin_bucket_ref(tommy_hashlin *hashlin,tommy_hash_t hash)

{
  long lVar1;
  tommy_hashlin_node **pptVar2;
  long in_FS_OFFSET;
  tommy_hash_t local_20;
  tommy_count_t high_pos;
  tommy_count_t pos;
  tommy_hash_t hash_local;
  tommy_hashlin *hashlin_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = hash & hashlin->low_mask;
  if (local_20 < hashlin->split) {
    local_20 = hash & hashlin->bucket_mask;
  }
  pptVar2 = tommy_hashlin_pos(hashlin,local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pptVar2;
  }
  __stack_chk_fail();
}

Assistant:

tommy_inline tommy_hashlin_node** tommy_hashlin_bucket_ref(tommy_hashlin* hashlin, tommy_hash_t hash)
{
	tommy_count_t pos;
	tommy_count_t high_pos;

	pos = hash & hashlin->low_mask;
	high_pos = hash & hashlin->bucket_mask;

	/* if this position is already allocated in the high half */
	if (pos < hashlin->split) {
		/* The following assigment is expected to be implemented */
		/* with a conditional move instruction */
		/* that results in a little better and constant performance */
		/* regardless of the split position. */
		/* This affects mostly the worst case, when the split value */
		/* is near at its half, resulting in a totally unpredictable */
		/* condition by the CPU. */
		/* In such case the use of the conditional move is generally faster. */

		/* use also the high bit */
		pos = high_pos;
	}

	return tommy_hashlin_pos(hashlin, pos);
}